

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualMulti.cpp
# Opt level: O2

void __thiscall HEkkDual::majorChooseRow(HEkkDual *this)

{
  double dVar1;
  double dVar2;
  HEkk *pHVar3;
  pointer pdVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  bool bVar8;
  ulong uVar9;
  pointer piVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  HighsInt i;
  long lVar14;
  int iVar15;
  HighsInt i_1;
  HEkkDualRHS *this_00;
  int iVar16;
  MChoice *pMVar17;
  HighsInt ich;
  HighsInt initialCount;
  allocator_type local_59;
  MChoice *local_58;
  HEkkDualRHS *local_50;
  vector<int,_std::allocator<int>_> choiceIndex;
  
  if ((this->ekk_instance_->info_).update_count == 0) {
    this->multi_chooseAgain = 1;
  }
  else if (this->multi_chooseAgain == 0) {
    return;
  }
  this->multi_chooseAgain = 0;
  this->multi_iteration = this->multi_iteration + 1;
  initialCount = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (&choiceIndex,(long)this->multi_num,&initialCount,&local_59);
  pHVar3 = this->ekk_instance_;
  local_50 = &this->dualRHS;
  local_58 = this->multi_choice;
  this_00 = local_50;
  do {
    while( true ) {
      initialCount = 0;
      HEkkDualRHS::chooseMultiHyperGraphAuto
                (this_00,choiceIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,&initialCount,this->multi_num);
      dVar1 = (this->dualRHS).workCutoff;
      if (((initialCount == 0) && (dVar1 == 0.0)) && (!NAN(dVar1))) goto LAB_0033bf3c;
      pdVar4 = (this->dualRHS).work_infeasibility.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      uVar13 = 0;
      for (lVar14 = 0; iVar15 = (int)uVar13, lVar14 < initialCount; lVar14 = lVar14 + 1) {
        iVar16 = choiceIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar14];
        if (dVar1 <= pdVar4[iVar16] /
                     (pHVar3->dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar16]) {
          uVar13 = (ulong)(iVar15 + 1);
          choiceIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[iVar15] = iVar16;
        }
      }
      if ((initialCount != 0) && (initialCount / 3 < iVar15)) break;
      HEkkDualRHS::createInfeasList(this_00,(this->ekk_instance_->info_).col_aq_density);
    }
    uVar9 = (ulong)(uint)this->multi_num;
    if (this->multi_num < 1) {
      uVar9 = 0;
    }
    for (lVar14 = 0; uVar9 * 0x248 - lVar14 != 0; lVar14 = lVar14 + 0x248) {
      *(undefined4 *)((long)&this->multi_choice[0].row_out + lVar14) = 0xffffffff;
    }
    uVar9 = 0;
    if (0 < iVar15) {
      uVar9 = uVar13;
    }
    piVar10 = choiceIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    for (lVar14 = 0; uVar9 * 0x92 - lVar14 != 0; lVar14 = lVar14 + 0x92) {
      (&this->multi_choice[0].row_out)[lVar14] = *piVar10;
      piVar10 = piVar10 + 1;
    }
    majorChooseRowBtran(this);
    lVar14 = 0;
    pMVar17 = local_58;
    while( true ) {
      uVar12 = this->multi_num;
      uVar13 = (ulong)(int)uVar12;
      if ((long)uVar13 <= lVar14) break;
      if (-1 < pMVar17->row_out) {
        HEkk::updateOperationResultDensity
                  (this->ekk_instance_,
                   (double)(pMVar17->row_ep).count / (double)this->solver_num_row,
                   &(this->ekk_instance_->info_).row_ep_density);
      }
      lVar14 = lVar14 + 1;
      pMVar17 = pMVar17 + 1;
    }
    if (this->edge_weight_mode != kSteepestEdge) break;
    iVar16 = 0;
    pMVar17 = local_58;
    for (lVar14 = 0; uVar12 = (uint)uVar13, lVar14 < (int)uVar12; lVar14 = lVar14 + 1) {
      lVar11 = (long)pMVar17->row_out;
      if (-1 < lVar11) {
        pdVar4 = (pHVar3->dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        dVar1 = pdVar4[lVar11];
        dVar2 = pMVar17->infeasEdWt;
        pdVar4[lVar11] = dVar2;
        this->computed_edge_weight = dVar2;
        bVar8 = acceptDualSteepestEdgeWeight(this,dVar1);
        if (!bVar8) {
          pMVar17->row_out = -1;
          iVar16 = iVar16 + 1;
        }
      }
      uVar13 = (ulong)(uint)this->multi_num;
      pMVar17 = pMVar17 + 1;
    }
    this_00 = local_50;
  } while (iVar15 / 3 < iVar16);
  this->multi_chosen = 0;
  pdVar5 = this->baseValue;
  pdVar6 = this->baseLower;
  pdVar7 = this->baseUpper;
  uVar9 = 0;
  uVar13 = (ulong)uVar12;
  if ((int)uVar12 < 1) {
    uVar13 = uVar9;
  }
  pdVar4 = (this->dualRHS).work_infeasibility.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  iVar15 = 0;
  for (; uVar13 * 0x248 - uVar9 != 0; uVar9 = uVar9 + 0x248) {
    lVar14 = (long)*(int *)((long)&this->multi_choice[0].row_out + uVar9);
    if (-1 < lVar14) {
      iVar15 = iVar15 + 1;
      this->multi_chosen = iVar15;
      *(double *)((long)&this->multi_choice[0].baseValue + uVar9) = pdVar5[lVar14];
      *(double *)((long)&this->multi_choice[0].baseLower + uVar9) = pdVar6[lVar14];
      *(double *)((long)&this->multi_choice[0].baseUpper + uVar9) = pdVar7[lVar14];
      *(double *)((long)&this->multi_choice[0].infeasValue + uVar9) = pdVar4[lVar14];
      dVar1 = (pHVar3->dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar14];
      *(double *)((long)&this->multi_choice[0].infeasEdWt + uVar9) = dVar1;
      *(double *)((long)&this->multi_choice[0].infeasLimit + uVar9) =
           (pdVar4[lVar14] / dVar1) * 0.95;
    }
  }
  this->multi_nFinish = 0;
LAB_0033bf3c:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&choiceIndex.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void HEkkDual::majorChooseRow() {
  /**
   * 0. Initial check to see if we need to do it again
   */
  if (ekk_instance_.info_.update_count == 0) multi_chooseAgain = 1;
  if (!multi_chooseAgain) return;
  multi_chooseAgain = 0;
  multi_iteration++;
  /**
   * Major loop:
   *     repeat 1-5, until we found a good sets of choices
   */
  std::vector<HighsInt> choiceIndex(multi_num, 0);
  std::vector<double>& edge_weight = ekk_instance_.dual_edge_weight_;
  for (;;) {
    // 1. Multiple CHUZR
    HighsInt initialCount = 0;

    // Call the hyper-graph method, but partSwitch=0 so just uses
    // choose_multi_global
    dualRHS.chooseMultiHyperGraphAuto(choiceIndex.data(), &initialCount,
                                      multi_num);
    // dualRHS.chooseMultiGlobal(choiceIndex.data(), &initialCount, multi_num);
    if (initialCount == 0 && dualRHS.workCutoff == 0) {
      // OPTIMAL
      return;
    }

    // 2. Shrink the size by cutoff
    HighsInt choiceCount = 0;
    for (HighsInt i = 0; i < initialCount; i++) {
      HighsInt iRow = choiceIndex[i];
      if (dualRHS.work_infeasibility[iRow] / edge_weight[iRow] >=
          dualRHS.workCutoff) {
        choiceIndex[choiceCount++] = iRow;
      }
    }

    if (initialCount == 0 || choiceCount <= initialCount / 3) {
      // Need to do the list again
      dualRHS.createInfeasList(ekk_instance_.info_.col_aq_density);
      continue;
    }

    // 3. Store the choiceIndex to buffer
    for (HighsInt ich = 0; ich < multi_num; ich++)
      multi_choice[ich].row_out = kNoRowChosen;
    for (HighsInt ich = 0; ich < choiceCount; ich++)
      multi_choice[ich].row_out = choiceIndex[ich];

    // 4. Parallel BTRAN and compute weight
    majorChooseRowBtran();

    // 5. Update row densities
    for (HighsInt ich = 0; ich < multi_num; ich++) {
      if (multi_choice[ich].row_out >= 0) {
        const double local_row_ep_density =
            (double)multi_choice[ich].row_ep.count / solver_num_row;
        ekk_instance_.updateOperationResultDensity(
            local_row_ep_density, ekk_instance_.info_.row_ep_density);
      }
    }

    if (edge_weight_mode == EdgeWeightMode::kSteepestEdge) {
      // 6. Check updated and computed weight - just for dual steepest edge
      HighsInt countWrongEdWt = 0;
      for (HighsInt i = 0; i < multi_num; i++) {
        const HighsInt iRow = multi_choice[i].row_out;
        if (iRow < 0) continue;
        double updated_edge_weight = edge_weight[iRow];
        computed_edge_weight = edge_weight[iRow] = multi_choice[i].infeasEdWt;
        //      if (updated_edge_weight < 0.25 * computed_edge_weight) {
        if (!acceptDualSteepestEdgeWeight(updated_edge_weight)) {
          multi_choice[i].row_out = kNoRowChosen;
          countWrongEdWt++;
        }
      }
      if (countWrongEdWt <= choiceCount / 3) break;
    } else {
      // No checking required if not using dual steepest edge so break
      break;
    }
  }

  // 6. Take other info associated with choices
  multi_chosen = 0;
  const double kPamiCutoff = 0.95;
  for (HighsInt i = 0; i < multi_num; i++) {
    const HighsInt iRow = multi_choice[i].row_out;
    if (iRow < 0) continue;
    multi_chosen++;
    // Other info
    multi_choice[i].baseValue = baseValue[iRow];
    multi_choice[i].baseLower = baseLower[iRow];
    multi_choice[i].baseUpper = baseUpper[iRow];
    multi_choice[i].infeasValue = dualRHS.work_infeasibility[iRow];
    multi_choice[i].infeasEdWt = edge_weight[iRow];
    multi_choice[i].infeasLimit =
        dualRHS.work_infeasibility[iRow] / edge_weight[iRow];
    multi_choice[i].infeasLimit *= kPamiCutoff;
  }

  // 6. Finish count
  multi_nFinish = 0;
}